

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O3

void TestDiscard(void)

{
  _Map_pointer ppCVar1;
  element_type *peVar2;
  int iVar3;
  ulong uVar4;
  size_t *local_118;
  size_t *local_110;
  int chunks;
  uint uStack_104;
  size_t remainder;
  begin local_f8;
  undefined1 *local_e0;
  lazy_ostream local_d8;
  undefined8 *local_c8;
  size_t **local_c0;
  assertion_result local_b8;
  _func_int **local_a0;
  OutputBuffer ob;
  const_string local_88;
  _func_int **local_78;
  _func_int **local_70;
  size_t dataSize;
  lazy_ostream local_60;
  undefined8 *local_50;
  char *local_48;
  undefined8 local_40;
  undefined **local_38;
  
  local_f8.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_f8.m_file_name.m_end = "";
  local_f8.m_line_num = 0x9a;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  local_60._vptr_lazy_ostream = (_func_int **)CONCAT71(local_60._vptr_lazy_ostream._1_7_,1);
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc770;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = (size_t **)0x1b3270;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_60);
  avro::OutputBuffer::OutputBuffer(&ob,0);
  dataSize = 0x2800;
  addDataToBuffer(&ob,0x2800);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa0;
  local_60.m_empty = false;
  local_a0 = (_func_int **)&PTR__lazy_ostream_001dc7b0;
  local_60._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7b0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  remainder = (ob.pimpl_.px)->size_;
  local_110 = &remainder;
  local_118 = &dataSize;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(remainder == dataSize);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_c0 = &local_110;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7f0;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_70 = (_func_int **)&PTR__lazy_ostream_001dc7f0;
  local_f8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc7f0;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xa0,CHECK,CHECK_EQUAL,2,"ob.size()",&local_d8,"dataSize"
             ,&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa1;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  remainder = (ob.pimpl_.px)->freeSpace_;
  local_118 = (size_t *)&chunks;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(remainder == 0x800);
  _chunks = 0x800;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_70;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xa1,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_d8,
             "kDefaultBlockSize/2",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa2;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  remainder = CONCAT44(remainder._4_4_,iVar3);
  chunks = 1;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 1);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc870;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_78 = (_func_int **)&PTR__lazy_ostream_001dc870;
  local_f8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc870;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xa2,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_d8,"1",
             &local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa3;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  remainder = CONCAT44(remainder._4_4_,iVar3);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 3);
  chunks = 3;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_empty = false;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xa3,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_d8,
             "3",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  peVar2 = ob.pimpl_.px;
  std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::clear
            (&(ob.pimpl_.px)->readChunks_);
  peVar2->size_ = 0;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa7;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  remainder = (ob.pimpl_.px)->size_;
  _chunks = (ulong)uStack_104 << 0x20;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(remainder == 0);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_38 = &PTR__lazy_ostream_001dc830;
  local_f8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc830;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xa7,CHECK,CHECK_EQUAL,2,"ob.size()",&local_d8,"0U",
             &local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa8;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  remainder = (ob.pimpl_.px)->freeSpace_;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(remainder == 0x800);
  _chunks = 0x800;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_70;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xa8,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_d8,
             "kDefaultBlockSize/2",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa9;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  remainder = CONCAT44(remainder._4_4_,iVar3);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 1);
  chunks = 1;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_empty = false;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xa9,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_d8,"1",
             &local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xaa;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  remainder = CONCAT44(remainder._4_4_,iVar3);
  _chunks = (ulong)uStack_104 << 0x20;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_empty = false;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xaa,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_d8,
             "0",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::detail::shared_count::~shared_count(&ob.pimpl_.pn);
  avro::OutputBuffer::OutputBuffer(&ob,0);
  dataSize = 0x2800;
  addDataToBuffer(&ob,0x2800);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xb3;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  remainder = (ob.pimpl_.px)->size_;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(remainder == dataSize);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = &dataSize;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_70;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xb3,CHECK,CHECK_EQUAL,2,"ob.size()",&local_d8,"dataSize"
             ,&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xb4;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  remainder = (ob.pimpl_.px)->freeSpace_;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(remainder == 0x800);
  _chunks = 0x800;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_70;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xb4,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_d8,
             "kDefaultBlockSize/2",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xb5;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  remainder = CONCAT44(remainder._4_4_,iVar3);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 1);
  chunks = 1;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_empty = false;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xb5,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_d8,"1",
             &local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xb6;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  remainder = CONCAT44(remainder._4_4_,iVar3);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 3);
  _chunks = CONCAT44(uStack_104,3);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_empty = false;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xb6,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_d8,
             "3",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xba;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  remainder = (ob.pimpl_.px)->size_;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(remainder == dataSize);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = &dataSize;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_70;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xba,CHECK,CHECK_EQUAL,2,"ob.size()",&local_d8,"dataSize"
             ,&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xbb;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  remainder = (ob.pimpl_.px)->freeSpace_;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(remainder == 0x800);
  _chunks = 0x800;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_70;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xbb,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_d8,
             "kDefaultBlockSize/2",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xbc;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  remainder = CONCAT44(remainder._4_4_,iVar3);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 1);
  chunks = 1;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_empty = false;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xbc,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_d8,"1",
             &local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xbd;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  remainder = CONCAT44(remainder._4_4_,iVar3);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 3);
  _chunks = CONCAT44(uStack_104,3);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_empty = false;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xbd,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_d8,
             "3",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::detail::shared_count::~shared_count(&ob.pimpl_.pn);
  avro::OutputBuffer::OutputBuffer(&ob,0);
  dataSize = 0x2800;
  addDataToBuffer(&ob,0x2800);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xc6;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  remainder = (ob.pimpl_.px)->size_;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(remainder == dataSize);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = &dataSize;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_70;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xc6,CHECK,CHECK_EQUAL,2,"ob.size()",&local_d8,"dataSize"
             ,&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 199;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  remainder = (ob.pimpl_.px)->freeSpace_;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(remainder == 0x800);
  _chunks = 0x800;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_70;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,199,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_d8,
             "kDefaultBlockSize/2",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 200;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  remainder = CONCAT44(remainder._4_4_,iVar3);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 1);
  chunks = 1;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_empty = false;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,200,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_d8,"1",
             &local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xc9;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  remainder = CONCAT44(remainder._4_4_,iVar3);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 3);
  _chunks = CONCAT44(uStack_104,3);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_empty = false;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xc9,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_d8,
             "3",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  avro::OutputBuffer::discardData(&ob,0x1000);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xcd;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  remainder = (ob.pimpl_.px)->size_;
  _chunks = dataSize - 0x1000;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(remainder == _chunks);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_70;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xcd,CHECK,CHECK_EQUAL,2,"ob.size()",&local_d8,
             "dataSize - kDefaultBlockSize",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xce;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  remainder = (ob.pimpl_.px)->freeSpace_;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(remainder == 0x800);
  _chunks = 0x800;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_70;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xce,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_d8,
             "kDefaultBlockSize/2",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xcf;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  remainder = CONCAT44(remainder._4_4_,iVar3);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 1);
  chunks = 1;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_empty = false;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xcf,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_d8,"1",
             &local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xd0;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  remainder = CONCAT44(remainder._4_4_,iVar3);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 2);
  _chunks = CONCAT44(uStack_104,2);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_empty = false;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xd0,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_d8,
             "2",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::detail::shared_count::~shared_count(&ob.pimpl_.pn);
  avro::OutputBuffer::OutputBuffer(&ob,0);
  dataSize = 0x2800;
  addDataToBuffer(&ob,0x2800);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xd8;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  remainder = (ob.pimpl_.px)->size_;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(remainder == dataSize);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = &dataSize;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_70;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xd8,CHECK,CHECK_EQUAL,2,"ob.size()",&local_d8,"dataSize"
             ,&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xd9;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  remainder = (ob.pimpl_.px)->freeSpace_;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(remainder == 0x800);
  _chunks = 0x800;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_70;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xd9,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_d8,
             "kDefaultBlockSize/2",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xda;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  remainder = CONCAT44(remainder._4_4_,iVar3);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 1);
  chunks = 1;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_empty = false;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xda,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_d8,"1",
             &local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xdb;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  remainder = CONCAT44(remainder._4_4_,iVar3);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 3);
  _chunks = CONCAT44(uStack_104,3);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_empty = false;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = &remainder;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = (size_t *)&chunks;
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xdb,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_d8,
             "3",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  remainder = dataSize % 100;
  if (100 < (ob.pimpl_.px)->size_) {
    uVar4 = 100;
    do {
      avro::OutputBuffer::discardData(&ob,100);
      dataSize = dataSize - 100;
      boost::unit_test::anon_unknown_0::s_log_impl();
      std::__cxx11::string::_M_replace
                (0x1df890,0,
                 (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                         m_message._M_string_length,0x1b937c);
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
      ;
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end =
           "";
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xe6;
      local_60.m_empty = false;
      local_60._vptr_lazy_ostream = local_a0;
      local_50 = &boost::unit_test::lazy_ostream::inst;
      local_48 = "";
      _chunks = (ob.pimpl_.px)->size_;
      local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(_chunks == dataSize);
      local_b8.m_message.px = (element_type *)0x0;
      local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_88.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
      ;
      local_88.m_end = "";
      local_110 = (size_t *)&chunks;
      local_d8.m_empty = false;
      local_d8._vptr_lazy_ostream = local_70;
      local_c8 = &boost::unit_test::lazy_ostream::inst;
      local_c0 = &local_110;
      local_118 = &dataSize;
      local_f8.m_file_name.m_end =
           (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
      local_f8.m_file_name.m_begin = (iterator)local_70;
      local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
      local_e0 = (undefined1 *)&local_118;
      boost::test_tools::tt_detail::report_assertion
                (&local_b8,&local_60,&local_88,0xe6,CHECK,CHECK_EQUAL,2,"ob.size()",&local_d8,
                 "dataSize",&local_f8);
      boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
      boost::unit_test::anon_unknown_0::s_log_impl();
      std::__cxx11::string::_M_replace
                (0x1df890,0,
                 (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                         m_message._M_string_length,0x1b937c);
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
      ;
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end =
           "";
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xe7;
      local_60.m_empty = false;
      local_60._vptr_lazy_ostream = local_a0;
      local_50 = &boost::unit_test::lazy_ostream::inst;
      local_48 = "";
      _chunks = (ob.pimpl_.px)->freeSpace_;
      local_40 = 0x800;
      local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(_chunks == 0x800);
      local_b8.m_message.px = (element_type *)0x0;
      local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_88.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
      ;
      local_88.m_end = "";
      local_110 = (size_t *)&chunks;
      local_d8.m_empty = false;
      local_d8._vptr_lazy_ostream = local_70;
      local_c8 = &boost::unit_test::lazy_ostream::inst;
      local_c0 = &local_110;
      local_118 = &local_40;
      local_f8.m_file_name.m_end =
           (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
      local_f8.m_file_name.m_begin = (iterator)local_70;
      local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
      local_e0 = (undefined1 *)&local_118;
      boost::test_tools::tt_detail::report_assertion
                (&local_b8,&local_60,&local_88,0xe7,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_d8,
                 "kDefaultBlockSize/2",&local_f8);
      boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
      boost::unit_test::anon_unknown_0::s_log_impl();
      std::__cxx11::string::_M_replace
                (0x1df890,0,
                 (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                         m_message._M_string_length,0x1b937c);
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
      ;
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end =
           "";
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xe8;
      local_60.m_empty = false;
      local_60._vptr_lazy_ostream = local_a0;
      local_50 = &boost::unit_test::lazy_ostream::inst;
      local_48 = "";
      ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl
                .super__Deque_impl_data._M_finish._M_node;
      iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                                  super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                           (long)((ob.pimpl_.px)->writeChunks_).
                                 super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) *
              -0x49249249 +
              (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                                  super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                           (long)((ob.pimpl_.px)->writeChunks_).
                                 super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) *
              -0x49249249 +
              ((int)((ulong)((long)ppCVar1 -
                            (long)((ob.pimpl_.px)->writeChunks_).
                                  super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
              (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
      local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar3 == 1);
      local_40._0_4_ = 1;
      local_b8.m_message.px = (element_type *)0x0;
      local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_88.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
      ;
      local_88.m_end = "";
      local_110 = (size_t *)&chunks;
      local_d8.m_empty = false;
      local_d8._vptr_lazy_ostream = local_78;
      local_c8 = &boost::unit_test::lazy_ostream::inst;
      local_c0 = &local_110;
      local_118 = &local_40;
      local_f8.m_file_name.m_end =
           (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
      local_f8.m_file_name.m_begin = (iterator)local_78;
      local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
      local_e0 = (undefined1 *)&local_118;
      chunks = iVar3;
      boost::test_tools::tt_detail::report_assertion
                (&local_b8,&local_60,&local_88,0xe8,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_d8,
                 "1",&local_f8);
      boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
      _chunks = CONCAT44(uStack_104,3 - (int)(uVar4 >> 0xc));
      boost::unit_test::anon_unknown_0::s_log_impl();
      std::__cxx11::string::_M_replace
                (0x1df890,0,
                 (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                         m_message._M_string_length,0x1b937c);
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
      ;
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end =
           "";
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xeb;
      local_60.m_empty = false;
      local_60._vptr_lazy_ostream = local_a0;
      local_50 = &boost::unit_test::lazy_ostream::inst;
      local_48 = "";
      ppCVar1 = ((ob.pimpl_.px)->readChunks_).
                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl
                .super__Deque_impl_data._M_finish._M_node;
      iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                                  super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                           (long)((ob.pimpl_.px)->readChunks_).
                                 super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) *
              -0x49249249 +
              (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                                  super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                           (long)((ob.pimpl_.px)->readChunks_).
                                 super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) *
              -0x49249249 +
              ((int)((ulong)((long)ppCVar1 -
                            (long)((ob.pimpl_.px)->readChunks_).
                                  super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
              (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
      local_40 = CONCAT44(local_40._4_4_,iVar3);
      local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(chunks == iVar3);
      local_b8.m_message.px = (element_type *)0x0;
      local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_88.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
      ;
      local_88.m_end = "";
      local_110 = &local_40;
      local_d8.m_empty = false;
      local_d8._vptr_lazy_ostream = local_78;
      local_c8 = &boost::unit_test::lazy_ostream::inst;
      local_c0 = &local_110;
      local_118 = (size_t *)&chunks;
      local_f8.m_file_name.m_end =
           (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
      local_f8.m_file_name.m_begin = (iterator)local_78;
      local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
      local_e0 = (undefined1 *)&local_118;
      boost::test_tools::tt_detail::report_assertion
                (&local_b8,&local_60,&local_88,0xeb,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",
                 &local_d8,"chunks",&local_f8);
      boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
      uVar4 = uVar4 + 100;
    } while (100 < (ob.pimpl_.px)->size_);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xee;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  _chunks = (ob.pimpl_.px)->size_;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(_chunks == remainder);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = (size_t *)&chunks;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_118 = &remainder;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_70;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xee,CHECK,CHECK_EQUAL,2,"ob.size()",&local_d8,
             "remainder",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xef;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  _chunks = (ob.pimpl_.px)->freeSpace_;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(_chunks == 0x800);
  local_40 = 0x800;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = (size_t *)&chunks;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_70;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_118 = &local_40;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xef,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_d8,
             "kDefaultBlockSize/2",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xf0;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 1);
  local_40._0_4_ = 1;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_empty = false;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = (size_t *)&chunks;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_118 = &local_40;
  local_e0 = (undefined1 *)&local_118;
  chunks = iVar3;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xf0,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_d8,"1",
             &local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xf1;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  _chunks = CONCAT44(uStack_104,iVar3);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 1);
  local_40._0_4_ = 1;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_empty = false;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = (size_t *)&chunks;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_118 = &local_40;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xf1,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_d8,
             "1",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  avro::OutputBuffer::discardData(&ob,(ob.pimpl_.px)->size_ + 1);
  avro::OutputBuffer::discardData(&ob,(ob.pimpl_.px)->size_);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xfb;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  _chunks = (ob.pimpl_.px)->size_;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(_chunks == 0);
  local_40 = (ulong)local_40._4_4_ << 0x20;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = (size_t *)&chunks;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_38;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_118 = &local_40;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xfb,CHECK,CHECK_EQUAL,2,"ob.size()",&local_d8,"0U",
             &local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xfc;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  _chunks = (ob.pimpl_.px)->freeSpace_;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(_chunks == 0x800);
  local_40 = 0x800;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = (size_t *)&chunks;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_70;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_70;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_118 = &local_40;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xfc,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_d8,
             "kDefaultBlockSize/2",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xfd;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 1);
  local_40._0_4_ = 1;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_empty = false;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = (size_t *)&chunks;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_118 = &local_40;
  local_e0 = (undefined1 *)&local_118;
  chunks = iVar3;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xfd,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_d8,"1",
             &local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xfe;
  local_60.m_empty = false;
  local_60._vptr_lazy_ostream = local_a0;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  _chunks = CONCAT44(uStack_104,iVar3);
  local_40 = (ulong)local_40._4_4_ << 0x20;
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88.m_end = "";
  local_110 = (size_t *)&chunks;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = local_78;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_110;
  local_f8.m_file_name.m_end = (iterator)((ulong)local_f8.m_file_name.m_end & 0xffffffffffffff00);
  local_f8.m_file_name.m_begin = (iterator)local_78;
  local_f8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_118 = &local_40;
  local_e0 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_60,&local_88,0xfe,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_d8,
             "0",&local_f8);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  boost::detail::shared_count::~shared_count(&ob.pimpl_.pn);
  return;
}

Assistant:

void TestDiscard()
{
    BOOST_TEST_MESSAGE( "TestDiscard");
    {
        OutputBuffer ob;
        size_t dataSize = kDefaultBlockSize*2 + kDefaultBlockSize/2;
        addDataToBuffer(ob, dataSize);

        BOOST_CHECK_EQUAL(ob.size(), dataSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 3);

        ob.discardData();

        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);
    }

    {
        // discard no bytes
        OutputBuffer ob;
        size_t dataSize = kDefaultBlockSize*2 + kDefaultBlockSize/2;
        addDataToBuffer(ob, dataSize);

        BOOST_CHECK_EQUAL(ob.size(), dataSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 3);

        ob.discardData(0);

        BOOST_CHECK_EQUAL(ob.size(), dataSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 3);
    }

    { 
        // discard exactly one block
        OutputBuffer ob;
        size_t dataSize = kDefaultBlockSize*2 + kDefaultBlockSize/2;
        addDataToBuffer(ob, dataSize);

        BOOST_CHECK_EQUAL(ob.size(), dataSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 3);

        ob.discardData(kDefaultBlockSize);

        BOOST_CHECK_EQUAL(ob.size(), dataSize - kDefaultBlockSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 2);
    }

    {
        OutputBuffer ob;
        size_t dataSize = kDefaultBlockSize*2 + kDefaultBlockSize/2;
        addDataToBuffer(ob, dataSize);

        BOOST_CHECK_EQUAL(ob.size(), dataSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 3);

        size_t remainder = dataSize % 100;

        // discard data 100 bytes at a time
        size_t discarded = 0;
        while(ob.size() > 100) {
            ob.discardData(100);
            dataSize -= 100;
            discarded += 100;

            BOOST_CHECK_EQUAL(ob.size(), dataSize);
            BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
            BOOST_CHECK_EQUAL(ob.numChunks(), 1);

            int chunks = 3 - (discarded / kDefaultBlockSize);
            BOOST_CHECK_EQUAL(ob.numDataChunks(), chunks);
        }

        BOOST_CHECK_EQUAL(ob.size(), remainder);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 1);

        try {
            ob.discardData(ob.size()+1);
        }
        catch (std::exception &e) {
            std::cout << "Intentionally triggered exception: " << e.what() << std::endl; 
        }
        ob.discardData(ob.size());

        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);
    }
}